

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O3

void __thiscall AsyncLogging::threadFunc(AsyncLogging *this)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  char *logline;
  pointer psVar4;
  pointer psVar5;
  pointer psVar6;
  FixedBuffer<4000000> *pFVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  ulong uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  MutexLockGuard lock;
  pthread_mutex_t *__mutex;
  ulong uVar11;
  const_iterator __cbeg;
  long lVar12;
  BufferVector buffersToWrite;
  BufferPtr newBuffer2;
  BufferPtr newBuffer1;
  LogFile output;
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  local_c8;
  FixedBuffer<4000000> *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  FixedBuffer<4000000> *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  Condition *local_88;
  pthread_mutex_t *local_80;
  BufferPtr *local_78;
  BufferVector *local_70;
  LogFile local_68;
  
  if (this->running_ == false) {
    __assert_fail("running_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                  ,0x30,"void AsyncLogging::threadFunc()");
  }
  CountDownLatch::countDown(&this->latch_);
  LogFile::LogFile(&local_68,&this->basename_,0x400);
  local_98 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  local_98->cur_ = (char *)local_98;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            (&_Stack_90,local_98);
  local_a8 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  local_a8->cur_ = (char *)local_a8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            (&_Stack_a0,local_a8);
  memset(local_98,0,4000000);
  memset(local_a8,0,4000000);
  local_c8.
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::reserve(&local_c8,0x10);
  __mutex = (pthread_mutex_t *)&this->mutex_;
  local_70 = &this->buffers_;
  local_88 = &this->cond_;
  local_78 = &this->currentBuffer_;
  local_80 = __mutex;
  while( true ) {
    if (this->running_ != true) {
      LogFile::flush(&local_68);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::~vector(&local_c8);
      if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
      }
      if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
      }
      LogFile::~LogFile(&local_68);
      return;
    }
    if ((local_98 == (FixedBuffer<4000000> *)0x0) || (*(int *)&local_98->cur_ != (int)local_98)) {
      __assert_fail("newBuffer1 && newBuffer1->length()==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                    ,0x3a,"void AsyncLogging::threadFunc()");
    }
    if ((local_a8 == (FixedBuffer<4000000> *)0x0) || (*(int *)&local_a8->cur_ != (int)local_a8)) {
      __assert_fail("newBuffer2 && newBuffer2->length()==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                    ,0x3b,"void AsyncLogging::threadFunc()");
    }
    if (local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("buffersToWrite.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                    ,0x3c,"void AsyncLogging::threadFunc()");
    }
    pthread_mutex_lock(__mutex);
    if ((this->buffers_).
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->buffers_).
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      Condition::waitForSeconds(local_88,this->flushInterval_);
    }
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::push_back(local_70,local_78);
    p_Var10 = (this->currentBuffer_).
              super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      p_Var10 = (this->currentBuffer_).
                super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
    }
    _Var8._M_pi = _Stack_90._M_pi;
    pFVar7 = local_98;
    local_98 = (FixedBuffer<4000000> *)0x0;
    _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pFVar7;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var8._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    _Var8._M_pi = _Stack_a0._M_pi;
    pFVar7 = local_a8;
    psVar1 = (this->buffers_).
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->buffers_).
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar3 = (this->buffers_).
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->buffers_).
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_c8.
         super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->buffers_).
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_c8.
         super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->buffers_).
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c8.
         super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c8.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar1;
    local_c8.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar2;
    local_c8.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar3;
    if ((this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      local_a8 = (FixedBuffer<4000000> *)0x0;
      _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var10 = (this->nextBuffer_).
                super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = pFVar7;
      (this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var8._M_pi;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      }
    }
    pthread_mutex_unlock(__mutex);
    if (local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    uVar9 = (long)local_c8.
                  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_c8.
                  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (400 < uVar9) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::_M_erase(&local_c8,
                 local_c8.
                 super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2,
                 (shared_ptr<FixedBuffer<4000000>_> *)
                 (uVar9 + (long)local_c8.
                                super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start));
      uVar9 = (long)local_c8.
                    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_c8.
                    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    }
    if (local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar9 = (long)uVar9 >> 4;
    }
    else {
      lVar12 = 0;
      uVar11 = 0;
      do {
        logline = *(char **)((long)&((local_c8.
                                      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar12);
        LogFile::append(&local_68,logline,*(int *)(logline + 4000000) - (int)logline);
        uVar11 = uVar11 + 1;
        uVar9 = (long)local_c8.
                      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8.
                      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
        lVar12 = lVar12 + 0x10;
      } while (uVar11 < uVar9);
    }
    __mutex = local_80;
    if (2 < uVar9) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::resize(&local_c8,2);
    }
    if (local_98 == (FixedBuffer<4000000> *)0x0) {
      if (local_c8.
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_c8.
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("!buffersToWrite.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                      ,0x5c,"void AsyncLogging::threadFunc()");
      }
      local_98 = local_c8.
                 super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_90,
                 &local_c8.
                  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      psVar1 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      p_Var10 = local_c8.
                super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      local_c8.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar1;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      }
      local_98->cur_ = local_98->data_;
    }
    psVar1 = local_c8.
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = local_c8.
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = local_c8.
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar4 = local_c8.
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_a8 == (FixedBuffer<4000000> *)0x0) {
      if (local_c8.
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_c8.
          super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("!buffersToWrite.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                      ,99,"void AsyncLogging::threadFunc()");
      }
      local_a8 = local_c8.
                 super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_a0,
                 &local_c8.
                  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      psVar1 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      p_Var10 = local_c8.
                super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      local_c8.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar1;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      }
      local_a8->cur_ = local_a8->data_;
      psVar1 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar3 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar4 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; psVar6 = local_c8.
                    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        psVar5 = local_c8.
                 super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = psVar2,
        local_c8.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar1; psVar1 = psVar1 + 1) {
      p_Var10 = (psVar1->super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      local_c8.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar4;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      }
      psVar2 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar3 = psVar5;
      psVar4 = local_c8.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_c8.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar6;
      local_c8.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar5;
    }
    local_c8.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar3;
    LogFile::flush(&local_68);
  }
  __assert_fail("!buffersToWrite.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                ,0x4d,"void AsyncLogging::threadFunc()");
}

Assistant:

void AsyncLogging::threadFunc(){
    assert(running_);
    latch_.countDown();
    LogFile output(basename_);
    BufferPtr newBuffer1(new Buffer);
    BufferPtr newBuffer2(new Buffer);
    newBuffer1->bzero();
    newBuffer2->bzero();
    BufferVector buffersToWrite;
    buffersToWrite.reserve(16);
    while (running_) {
        assert(newBuffer1 && newBuffer1->length()==0);
        assert(newBuffer2 && newBuffer2->length()==0);
        assert(buffersToWrite.empty());
        {
            MutexLockGuard lock(mutex_);
            if (buffers_.empty())
            {
                cond_.waitForSeconds(flushInterval_);
            }
            buffers_.push_back(currentBuffer_);
            currentBuffer_.reset();

            currentBuffer_ = std::move(newBuffer1);
            buffersToWrite.swap(buffers_);
            if(!nextBuffer_){
                nextBuffer_ = std::move(newBuffer2);
            }
        }

        assert(!buffersToWrite.empty());

        if(buffersToWrite.size() >25){
            buffersToWrite.erase(buffersToWrite.begin()+2, buffersToWrite.end());
        }

        for (size_t i=0; i<buffersToWrite.size(); ++i) {
            output.append(buffersToWrite[i]->data(), buffersToWrite[i]->length());
        }

        if(buffersToWrite.size() > 2){
            buffersToWrite.resize(2);
        }

        if(!newBuffer1){
            assert(!buffersToWrite.empty());
            newBuffer1 = buffersToWrite.back();
            buffersToWrite.pop_back();
            newBuffer1->reset();
        }

        if(!newBuffer2){
            assert(!buffersToWrite.empty());
            newBuffer2 = buffersToWrite.back();
            buffersToWrite.pop_back();
            newBuffer2->reset();
        }

        buffersToWrite.clear();
        output.flush();
    }
    output.flush();
}